

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_unary(JSParseState *s,int parse_flags)

{
  int iVar1;
  int iVar2;
  uint in_ESI;
  JSParseState *in_RDI;
  JSAtom name_1;
  int label_1;
  int scope_1;
  int op_2;
  int opcode_1;
  JSFunctionDef *fd;
  JSParseState *in_stack_00000048;
  JSAtom name;
  int label;
  int scope;
  int op_1;
  int opcode;
  int op;
  uint8_t val;
  JSParseState *s_00;
  undefined1 in_stack_ffffffffffffffa0 [16];
  int in_stack_ffffffffffffffb0;
  JSAtom in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  JSParseState *in_stack_ffffffffffffffc8;
  JSFunctionDef *fd_00;
  BOOL in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  JSParseState *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff8;
  
  s_00 = in_stack_ffffffffffffffa0._0_8_;
  iVar2 = (in_RDI->token).val;
  if (iVar2 + 0x6cU < 2) {
    iVar1 = next_token((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    val = (uint8_t)((uint)iVar2 >> 0x18);
    if (iVar1 != 0) {
      return -1;
    }
    iVar2 = js_parse_unary((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
    if (iVar2 != 0) {
      return -1;
    }
    iVar2 = get_lvalue(in_stack_ffffffffffffffd8,
                       (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (int *)in_stack_ffffffffffffffc8,
                       (JSAtom *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (BOOL)in_RDI,in_stack_fffffffffffffff8);
    if (iVar2 != 0) {
      return -1;
    }
    emit_op(in_stack_ffffffffffffffa0._0_8_,val);
    s_00 = in_stack_ffffffffffffffa0._0_8_;
    put_lvalue((JSParseState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0._12_4_,in_stack_ffffffffffffffd0)
    ;
  }
  else if (iVar2 == -0x4d) {
    iVar1 = js_parse_delete(in_stack_ffffffffffffffc8);
    val = (uint8_t)((uint)iVar2 >> 0x18);
    if (iVar1 != 0) {
      return -1;
    }
    in_ESI = 0;
  }
  else {
    if (iVar2 != -0x4c) {
      if (iVar2 == -0x4b) {
        iVar1 = next_token((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
        val = (uint8_t)((uint)iVar2 >> 0x18);
        if (iVar1 != 0) {
          return -1;
        }
        iVar2 = js_parse_unary((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                               in_stack_ffffffffffffffe4);
        if (iVar2 != 0) {
          return -1;
        }
        fd_00 = in_RDI->cur_func;
        iVar2 = get_prev_opcode(fd_00);
        if (iVar2 == 0xb6) {
          (fd_00->byte_code).buf[fd_00->last_opcode_pos] = 0xb5;
        }
        emit_op(s_00,val);
        in_ESI = 0;
        goto LAB_0019c665;
      }
      if (iVar2 == -0x28) {
        if ((*(ushort *)&in_RDI->cur_func->field_0x84 & 2) == 0) {
          iVar2 = js_parse_error(in_RDI,"unexpected \'await\' keyword");
          return iVar2;
        }
        if (in_RDI->cur_func->in_function_body == 0) {
          iVar2 = js_parse_error(in_RDI,"await in default expression");
          return iVar2;
        }
        iVar1 = next_token((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
        val = (uint8_t)((uint)iVar2 >> 0x18);
        if (iVar1 != 0) {
          return -1;
        }
        iVar2 = js_parse_unary((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                               in_stack_ffffffffffffffe4);
        if (iVar2 != 0) {
          return -1;
        }
        emit_op(s_00,val);
        in_ESI = 0;
        goto LAB_0019c665;
      }
      if ((((iVar2 != 0x21) && (iVar2 != 0x2b)) && (iVar2 != 0x2d)) && (iVar2 != 0x7e)) {
        iVar1 = js_parse_postfix_expr(in_stack_00000048,fd._4_4_);
        val = (uint8_t)((uint)iVar2 >> 0x18);
        s_00 = in_stack_ffffffffffffffa0._0_8_;
        if (iVar1 != 0) {
          return -1;
        }
        if ((in_RDI->got_lf == 0) &&
           (((in_RDI->token).val == -0x6c || ((in_RDI->token).val == -0x6b)))) {
          iVar2 = (in_RDI->token).val;
          iVar1 = get_lvalue(in_stack_ffffffffffffffd8,
                             (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             (int *)in_stack_ffffffffffffffc8,
                             (JSAtom *)CONCAT44(in_stack_ffffffffffffffc4,iVar2),
                             (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (BOOL)in_RDI,in_stack_fffffffffffffff8);
          if (iVar1 != 0) {
            return -1;
          }
          emit_op(in_stack_ffffffffffffffa0._0_8_,val);
          s_00 = in_stack_ffffffffffffffa0._0_8_;
          put_lvalue((JSParseState *)CONCAT44(in_stack_ffffffffffffffc4,iVar2),
                     in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0._12_4_,
                     in_stack_ffffffffffffffd0);
          iVar2 = next_token((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
          if (iVar2 != 0) {
            return -1;
          }
        }
        goto LAB_0019c665;
      }
    }
    in_stack_ffffffffffffffe8 = (in_RDI->token).val;
    iVar1 = next_token((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    val = (uint8_t)((uint)iVar2 >> 0x18);
    if (iVar1 != 0) {
      return -1;
    }
    iVar2 = js_parse_unary((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
    if (iVar2 != 0) {
      return -1;
    }
    if (in_stack_ffffffffffffffe8 == -0x4c) {
      emit_op(s_00,val);
      emit_op(s_00,val);
    }
    else if (in_stack_ffffffffffffffe8 == 0x21) {
      emit_op(s_00,val);
    }
    else if (in_stack_ffffffffffffffe8 == 0x2b) {
      emit_op(s_00,val);
    }
    else if (in_stack_ffffffffffffffe8 == 0x2d) {
      emit_op(s_00,val);
    }
    else {
      if (in_stack_ffffffffffffffe8 != 0x7e) {
        abort();
      }
      emit_op(s_00,val);
    }
    in_ESI = 0;
  }
LAB_0019c665:
  if (((in_ESI & 0x18) != 0) && ((in_RDI->token).val == -0x5d)) {
    if ((in_ESI & 0x10) != 0) {
      JS_ThrowSyntaxError(in_RDI->ctx,
                          "unparenthesized unary expression can\'t appear on the left-hand side of \'**\'"
                         );
      return -1;
    }
    iVar2 = next_token((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    if (iVar2 != 0) {
      return -1;
    }
    iVar2 = js_parse_unary((JSParseState *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
    if (iVar2 != 0) {
      return -1;
    }
    emit_op(s_00,val);
  }
  return 0;
}

Assistant:

static __exception int js_parse_unary(JSParseState *s, int parse_flags)
{
    int op;

    switch(s->token.val) {
    case '+':
    case '-':
    case '!':
    case '~':
    case TOK_VOID:
        op = s->token.val;
        if (next_token(s))
            return -1;
        if (js_parse_unary(s, PF_POW_FORBIDDEN))
            return -1;
        switch(op) {
        case '-':
            emit_op(s, OP_neg);
            break;
        case '+':
            emit_op(s, OP_plus);
            break;
        case '!':
            emit_op(s, OP_lnot);
            break;
        case '~':
            emit_op(s, OP_not);
            break;
        case TOK_VOID:
            emit_op(s, OP_drop);
            emit_op(s, OP_undefined);
            break;
        default:
            abort();
        }
        parse_flags = 0;
        break;
    case TOK_DEC:
    case TOK_INC:
        {
            int opcode, op, scope, label;
            JSAtom name;
            op = s->token.val;
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, 0))
                return -1;
            if (get_lvalue(s, &opcode, &scope, &name, &label, NULL, TRUE, op))
                return -1;
            emit_op(s, OP_dec + op - TOK_DEC);
            put_lvalue(s, opcode, scope, name, label, PUT_LVALUE_KEEP_TOP,
                       FALSE);
        }
        break;
    case TOK_TYPEOF:
        {
            JSFunctionDef *fd;
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, PF_POW_FORBIDDEN))
                return -1;
            /* reference access should not return an exception, so we
               patch the get_var */
            fd = s->cur_func;
            if (get_prev_opcode(fd) == OP_scope_get_var) {
                fd->byte_code.buf[fd->last_opcode_pos] = OP_scope_get_var_undef;
            }
            emit_op(s, OP_typeof);
            parse_flags = 0;
        }
        break;
    case TOK_DELETE:
        if (js_parse_delete(s))
            return -1;
        parse_flags = 0;
        break;
    case TOK_AWAIT:
        if (!(s->cur_func->func_kind & JS_FUNC_ASYNC))
            return js_parse_error(s, "unexpected 'await' keyword");
        if (!s->cur_func->in_function_body)
            return js_parse_error(s, "await in default expression");
        if (next_token(s))
            return -1;
        if (js_parse_unary(s, PF_POW_FORBIDDEN))
            return -1;
        emit_op(s, OP_await);
        parse_flags = 0;
        break;
    default:
        if (js_parse_postfix_expr(s, (parse_flags & PF_ARROW_FUNC) |
                                  PF_POSTFIX_CALL))
            return -1;
        if (!s->got_lf &&
            (s->token.val == TOK_DEC || s->token.val == TOK_INC)) {
            int opcode, op, scope, label;
            JSAtom name;
            op = s->token.val;
            if (get_lvalue(s, &opcode, &scope, &name, &label, NULL, TRUE, op))
                return -1;
            emit_op(s, OP_post_dec + op - TOK_DEC);
            put_lvalue(s, opcode, scope, name, label, PUT_LVALUE_KEEP_SECOND,
                       FALSE);
            if (next_token(s))
                return -1;        
        }
        break;
    }
    if (parse_flags & (PF_POW_ALLOWED | PF_POW_FORBIDDEN)) {
#ifdef CONFIG_BIGNUM
        if (s->token.val == TOK_POW || s->token.val == TOK_MATH_POW) {
            /* Extended exponentiation syntax rules: we extend the ES7
               grammar in order to have more intuitive semantics:
               -2**2 evaluates to -4. */
            if (!(s->cur_func->js_mode & JS_MODE_MATH)) {
                if (parse_flags & PF_POW_FORBIDDEN) {
                    JS_ThrowSyntaxError(s->ctx, "unparenthesized unary expression can't appear on the left-hand side of '**'");
                    return -1;
                }
            }
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, PF_POW_ALLOWED))
                return -1;
            emit_op(s, OP_pow);
        }
#else
        if (s->token.val == TOK_POW) {
            /* Strict ES7 exponentiation syntax rules: To solve
               conficting semantics between different implementations
               regarding the precedence of prefix operators and the
               postifx exponential, ES7 specifies that -2**2 is a
               syntax error. */
            if (parse_flags & PF_POW_FORBIDDEN) {
                JS_ThrowSyntaxError(s->ctx, "unparenthesized unary expression can't appear on the left-hand side of '**'");
                return -1;
            }
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, PF_POW_ALLOWED))
                return -1;
            emit_op(s, OP_pow);
        }
#endif
    }
    return 0;
}